

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.cpp
# Opt level: O0

void __thiscall EOServer::Tick(EOServer *this)

{
  World *pWVar1;
  bool bVar2;
  int iVar3;
  Client *this_00;
  mapped_type *pmVar4;
  pointer ppVar5;
  list<Client_*,_std::allocator<Client_*>_> *this_01;
  reference ppCVar6;
  mapped_type *pmVar7;
  vector<Client_*,_std::allocator<Client_*>_> *this_02;
  reference ppCVar8;
  double dVar9;
  double dVar10;
  EOClient *eoclient;
  Client *client_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Client_*,_std::allocator<Client_*>_> *__range2_1;
  Socket_SelectFailed *e;
  IPAddress local_108;
  IPAddress local_104;
  Client *local_100;
  Client *client;
  iterator __end2;
  iterator __begin2;
  list<Client_*,_std::allocator<Client_*>_> *__range2;
  __node_type *local_d8;
  _Node_iterator_base<std::pair<const_IPAddress,_ConnectionLogEntry>,_true> local_d0;
  _Node_iterator_base<std::pair<const_IPAddress,_ConnectionLogEntry>,_true> local_c8;
  double local_c0;
  double last_rejection_time;
  double last_connection_time;
  _Node_iterator_base<std::pair<const_IPAddress,_ConnectionLogEntry>,_true> local_a8;
  iterator connection;
  key_type local_98;
  int local_78;
  int max_per_ip;
  allocator<char> local_61;
  key_type local_60;
  double local_40;
  double reconnect_limit;
  byte local_2d;
  IPAddress remote_addr;
  bool throttle;
  int ip_connections;
  double now;
  EOClient *newclient;
  vector<Client_*,_std::allocator<Client_*>_> *active_clients;
  EOServer *this_local;
  
  this_00 = Server::Poll(&this->super_Server);
  if (this_00 != (Client *)0x0) {
    dVar9 = Timer::GetTime();
    remote_addr.address = 0;
    local_2d = 0;
    reconnect_limit._4_4_ = Client::GetRemoteAddr(this_00);
    pWVar1 = this->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"IPReconnectLimit",&local_61);
    pmVar4 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(pWVar1->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_60);
    dVar10 = util::variant::operator_cast_to_double(pmVar4);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    pWVar1 = this->world;
    local_40 = dVar10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"MaxConnectionsPerIP",
               (allocator<char> *)
               ((long)&connection.
                       super__Node_iterator_base<std::pair<const_IPAddress,_ConnectionLogEntry>,_true>
                       ._M_cur + 7));
    pmVar4 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(pWVar1->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_98);
    iVar3 = util::variant::operator_cast_to_int(pmVar4);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&connection.
                       super__Node_iterator_base<std::pair<const_IPAddress,_ConnectionLogEntry>,_true>
                       ._M_cur + 7));
    local_78 = iVar3;
    local_a8._M_cur =
         (__node_type *)
         std::
         begin<std::unordered_map<IPAddress,ConnectionLogEntry,std::hash<IPAddress>,std::equal_to<IPAddress>,std::allocator<std::pair<IPAddress_const,ConnectionLogEntry>>>>
                   (&this->connection_log);
    while( true ) {
      last_connection_time =
           (double)std::
                   end<std::unordered_map<IPAddress,ConnectionLogEntry,std::hash<IPAddress>,std::equal_to<IPAddress>,std::allocator<std::pair<IPAddress_const,ConnectionLogEntry>>>>
                             (&this->connection_log);
      bVar2 = std::__detail::operator!=
                        (&local_a8,
                         (_Node_iterator_base<std::pair<const_IPAddress,_ConnectionLogEntry>,_true>
                          *)&last_connection_time);
      if (!bVar2) break;
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_IPAddress,_ConnectionLogEntry>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_IPAddress,_ConnectionLogEntry>,_false,_true>
                           *)&local_a8);
      last_rejection_time = (ppVar5->second).last_connection_time;
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_IPAddress,_ConnectionLogEntry>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_IPAddress,_ConnectionLogEntry>,_false,_true>
                           *)&local_a8);
      local_c0 = (ppVar5->second).last_rejection_time;
      if ((dVar9 <= last_rejection_time + local_40) || (dVar9 <= local_c0 + 30.0)) {
        ppVar5 = std::__detail::
                 _Node_iterator<std::pair<const_IPAddress,_ConnectionLogEntry>,_false,_true>::
                 operator->((_Node_iterator<std::pair<const_IPAddress,_ConnectionLogEntry>,_false,_true>
                             *)&local_a8);
        bVar2 = IPAddress::operator==(&ppVar5->first,(IPAddress *)((long)&reconnect_limit + 4));
        if ((bVar2) && (dVar9 <= last_rejection_time + local_40)) {
          local_2d = 1;
        }
      }
      else {
        local_c8._M_cur = local_a8._M_cur;
        ClearClientRejections(this,(connection_log_iterator)local_a8._M_cur);
        local_d8 = local_a8._M_cur;
        local_d0._M_cur =
             (__node_type *)
             std::
             unordered_map<IPAddress,_ConnectionLogEntry,_std::hash<IPAddress>,_std::equal_to<IPAddress>,_std::allocator<std::pair<const_IPAddress,_ConnectionLogEntry>_>_>
             ::erase(&this->connection_log,local_a8._M_cur);
        local_a8._M_cur = local_d0._M_cur;
        __range2 = (list<Client_*,_std::allocator<Client_*>_> *)
                   std::
                   unordered_map<IPAddress,_ConnectionLogEntry,_std::hash<IPAddress>,_std::equal_to<IPAddress>,_std::allocator<std::pair<const_IPAddress,_ConnectionLogEntry>_>_>
                   ::end(&this->connection_log);
        bVar2 = std::__detail::operator==
                          (&local_a8,
                           (_Node_iterator_base<std::pair<const_IPAddress,_ConnectionLogEntry>,_true>
                            *)&__range2);
        if (bVar2) break;
      }
      std::__detail::_Node_iterator<std::pair<const_IPAddress,_ConnectionLogEntry>,_false,_true>::
      operator++((_Node_iterator<std::pair<const_IPAddress,_ConnectionLogEntry>,_false,_true> *)
                 &local_a8);
    }
    this_01 = &(this->super_Server).clients;
    __end2 = std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::begin(this_01);
    client = (Client *)std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::end(this_01);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&client), bVar2) {
      ppCVar6 = std::_List_iterator<Client_*>::operator*(&__end2);
      local_100 = *ppCVar6;
      local_104 = Client::GetRemoteAddr(local_100);
      local_108 = Client::GetRemoteAddr(this_00);
      bVar2 = IPAddress::operator==(&local_104,&local_108);
      if (bVar2) {
        remote_addr.address = remote_addr.address + 1;
      }
      std::_List_iterator<Client_*>::operator++(&__end2);
    }
    if ((local_2d & 1) == 0) {
      if ((local_78 == 0) || ((int)remote_addr.address <= local_78)) {
        dVar9 = Timer::GetTime();
        pmVar7 = std::
                 unordered_map<IPAddress,_ConnectionLogEntry,_std::hash<IPAddress>,_std::equal_to<IPAddress>,_std::allocator<std::pair<const_IPAddress,_ConnectionLogEntry>_>_>
                 ::operator[](&this->connection_log,(key_type *)((long)&reconnect_limit + 4));
        pmVar7->last_connection_time = dVar9;
      }
      else {
        e._0_4_ = Client::GetRemoteAddr(this_00);
        RecordClientRejection(this,(IPAddress *)&e,"too many connections from this address");
        Client::Close(this_00,true);
      }
    }
    else {
      e._4_4_ = Client::GetRemoteAddr(this_00);
      RecordClientRejection(this,(IPAddress *)((long)&e + 4),"reconnecting too fast");
      Client::Close(this_00,true);
    }
  }
  this_02 = Server::Select(&this->super_Server,0.001);
  if (this_02 != (vector<Client_*,_std::allocator<Client_*>_> *)0x0) {
    __end2_1 = std::vector<Client_*,_std::allocator<Client_*>_>::begin(this_02);
    client_1 = (Client *)std::vector<Client_*,_std::allocator<Client_*>_>::end(this_02);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<Client_**,_std::vector<Client_*,_std::allocator<Client_*>_>_>
                               *)&client_1), bVar2) {
      ppCVar8 = __gnu_cxx::
                __normal_iterator<Client_**,_std::vector<Client_*,_std::allocator<Client_*>_>_>::
                operator*(&__end2_1);
      EOClient::Tick((EOClient *)*ppCVar8);
      __gnu_cxx::__normal_iterator<Client_**,_std::vector<Client_*,_std::allocator<Client_*>_>_>::
      operator++(&__end2_1);
    }
    std::vector<Client_*,_std::allocator<Client_*>_>::clear(this_02);
  }
  Server::BuryTheDead(&this->super_Server);
  Timer::Tick(&this->world->timer);
  return;
}

Assistant:

void EOServer::Tick()
{
	std::vector<Client *> *active_clients = 0;
	EOClient *newclient = static_cast<EOClient *>(this->Poll());

	if (newclient)
	{
		double now = Timer::GetTime();
		int ip_connections = 0;
		bool throttle = false;
		IPAddress remote_addr = newclient->GetRemoteAddr();

		const double reconnect_limit = double(this->world->config["IPReconnectLimit"]);
		const int max_per_ip = int(this->world->config["MaxConnectionsPerIP"]);

		UTIL_IFOREACH(connection_log, connection)
		{
			double last_connection_time = connection->second.last_connection_time;
			double last_rejection_time = connection->second.last_rejection_time;

			if (last_connection_time + reconnect_limit < now
			 && last_rejection_time + 30.0 < now)
			{
				this->ClearClientRejections(connection);
				connection = connection_log.erase(connection);

				if (connection == connection_log.end())
					break;

				continue;
			}

			if (connection->first == remote_addr
			 && last_connection_time + reconnect_limit >= now)
			{
				throttle = true;
			}
		}

		UTIL_FOREACH(this->clients, client)
		{
			if (client->GetRemoteAddr() == newclient->GetRemoteAddr())
			{
				++ip_connections;
			}
		}

		if (throttle)
		{
			this->RecordClientRejection(newclient->GetRemoteAddr(), "reconnecting too fast");
			newclient->Close(true);
		}
		else if (max_per_ip != 0 && ip_connections > max_per_ip)
		{
			this->RecordClientRejection(newclient->GetRemoteAddr(), "too many connections from this address");
			newclient->Close(true);
		}
		else
		{
			connection_log[remote_addr].last_connection_time = Timer::GetTime();
		}
	}

	try
	{
		active_clients = this->Select(0.001);
	}
	catch (Socket_SelectFailed &e)
	{
		if (errno != EINTR)
			throw;
	}

	if (active_clients)
	{
		UTIL_FOREACH(*active_clients, client)
		{
			EOClient *eoclient = static_cast<EOClient *>(client);
			eoclient->Tick();
		}

		active_clients->clear();
	}

	this->BuryTheDead();

	this->world->timer.Tick();
}